

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O2

void addGoToRecord(xformDatabase *xdb,char *rec)

{
  goToRec *pgVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  double dVar5;
  
  if (rec != (char *)0x0 && xdb != (xformDatabase *)0x0) {
    pgVar1 = (goToRec *)malloc(0x48);
    if (pgVar1 == (goToRec *)0x0) {
      warn("could not create \'go to\' record");
      return;
    }
    pgVar1->next = (goToRec_t *)0x0;
    for (lVar2 = 1; lVar2 != 9; lVar2 = lVar2 + 1) {
      pgVar1->level[lVar2 + -1] = 0.0;
    }
    if (xdb->golist == (goToRec *)0x0) {
      xdb->golist = pgVar1;
    }
    if (xdb->glast != (goToRec *)0x0) {
      xdb->glast->next = pgVar1;
    }
    xdb->glast = pgVar1;
    pcVar3 = strtok(rec,":");
    if (pcVar3 != (char *)0x0) {
      pcVar3 = strtok((char *)0x0,":");
      for (uVar4 = 0; (pcVar3 != (char *)0x0 && (uVar4 < 8)); uVar4 = uVar4 + 1) {
        dVar5 = atof(pcVar3);
        pgVar1->level[uVar4] = dVar5;
        pcVar3 = strtok((char *)0x0,":");
      }
    }
  }
  return;
}

Assistant:

void addGoToRecord(xformDatabase* xdb, char *rec) {
   char *p = NULL;
   int i = 0;
   goToRec* g = NULL;

   if (xdb && rec) {
      g = (goToRec *)malloc(sizeof(goToRec));
      if (!g) {
         warn("could not create 'go to' record");
         return;
      }

      /* initialize */
      g->next = NULL;
      for(i = 0; i < MAX_XFORM_LEVELS; i++) {
         g->level[i] = 0.0;
      }

      if (! xdb->golist) { xdb->golist = g; }
      if (xdb->glast) { xdb->glast->next = g; }
      xdb->glast = g;

      p = strtok(rec, XFORMREC_DELIM); /* type id */
      if (p) {
	 p = strtok(NULL, XFORMREC_DELIM);
	 for(i=0; p && (i < MAX_XFORM_LEVELS); i++) {
	    g->level[i] = atof(p);
	    p = strtok(NULL, XFORMREC_DELIM);
	 }
      }
   }
}